

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic.t.cpp
# Opt level: O1

void f(int n)

{
  atomic_flag aVar1;
  ostream *poVar2;
  int iVar3;
  char local_29;
  
  iVar3 = 0;
  do {
    do {
      aVar1.super___atomic_flag_base._M_i = lock.super___atomic_flag_base._M_i;
      LOCK();
      lock.super___atomic_flag_base._M_i = (__atomic_flag_base)true;
      UNLOCK();
    } while (aVar1.super___atomic_flag_base._M_i != false);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Output from thread ",0x13);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,n);
    local_29 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
    lock.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
    iVar3 = iVar3 + 1;
  } while (iVar3 != 4);
  return;
}

Assistant:

void f( int n )
{
	for (int cnt = 0; cnt < 4; ++cnt)
	{
		// acquire lock:
		while ( lock.test_and_set(nonstd::memory_order_acquire) )
		{
			// spin read: only until a cmpxchg might succeed:
//			while( *p )
				_mm_pause();
		}

		std::cout << "Output from thread " << n << '\n';

		// release lock:
		lock.clear(nonstd::memory_order_release);
	}
}